

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomTwoAction.cpp
# Opt level: O2

ActionResults * __thiscall WhiteRoomTwoAction::Rest(WhiteRoomTwoAction *this)

{
  itemLocation iVar1;
  ActionResults *this_00;
  ItemWrapper *this_01;
  string *this_02;
  itemType local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  if (this->roomLit == true) {
    this_00 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_38,
               "After sitting down, you begin to realize that this room reminds you of your last 80\'s disco party. "
               ,(allocator *)&local_7c);
    ActionResults::ActionResults(this_00,CURRENT,&local_38);
    this_02 = &local_38;
  }
  else {
    local_7c = POWER_CRYSTAL;
    this_01 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_7c);
    iVar1 = ItemWrapper::getLocation(this_01);
    this_00 = (ActionResults *)operator_new(0x30);
    if (iVar1 == W_ROOM2) {
      std::__cxx11::string::string
                ((string *)&local_58,
                 "As you sit down, something pokes you in the rumpus. It feels like a crystal.",
                 (allocator *)&local_7c);
      ActionResults::ActionResults(this_00,CURRENT,&local_58);
      this_02 = &local_58;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_78,
                 "You and Bruce Wayne have something in common. You both like hanging out in the dark."
                 ,(allocator *)&local_7c);
      ActionResults::ActionResults(this_00,CURRENT,&local_78);
      this_02 = &local_78;
    }
  }
  std::__cxx11::string::~string((string *)this_02);
  return this_00;
}

Assistant:

ActionResults *WhiteRoomTwoAction::Rest() {
    if(roomLit){
        return new ActionResults(CURRENT, "After sitting down, you begin to realize that this room reminds you of your last 80's disco party. ");
    }
    else if(itemList->getValue(POWER_CRYSTAL)->getLocation() == W_ROOM2) {
        return new ActionResults(CURRENT, "As you sit down, something pokes you in the rumpus. It feels like a crystal.");
    }
    else {
        return new ActionResults(CURRENT, "You and Bruce Wayne have something in common. You both like hanging out in the dark.");
    }
}